

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

double __thiscall mjs::regexp_object::last_index(regexp_object *this)

{
  double dVar1;
  value local_30;
  
  value_representation::get_value
            (&local_30,&this->last_index_,(this->super_native_object).super_object.heap_);
  dVar1 = to_number(&local_30);
  value::~value(&local_30);
  return dVar1;
}

Assistant:

string get_source_string(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    auto& h = global->heap();

    if (s.empty()) {
        return string{h, empty_string_regexp};
    }

    std::wstring res;
    bool escape = false;
    for (uint32_t i = 0, l = static_cast<uint32_t>(s.length()); i < l; ++i) {
        const auto ch = s[i];
        if (escape) {
            escape = false;
        } else if (ch == '\\') {
            escape = true;
        } else if (ch == '/') {
            res.push_back('\\');
        }
        res.push_back(ch);
    }

    return string{h, res};
}